

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O3

void SUNDlsMat_bandMatvec
               (sunrealtype **a,sunrealtype *x,sunrealtype *y,sunindextype n,sunindextype mu,
               sunindextype ml,sunindextype smu)

{
  sunrealtype *psVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (0 < n) {
    memset(y,0,n * 8);
    lVar2 = -mu;
    lVar4 = smu << 3;
    lVar3 = 0;
    do {
      lVar5 = 0;
      if (0 < lVar2) {
        lVar5 = lVar2;
      }
      lVar7 = lVar3 - mu;
      if (lVar3 - mu < 1) {
        lVar7 = 0;
      }
      lVar6 = lVar3 + ml;
      if (n <= lVar3 + ml) {
        lVar6 = n + -1;
      }
      if (lVar7 <= lVar6) {
        lVar5 = lVar5 + -1;
        psVar1 = a[lVar3];
        do {
          y[lVar5 + 1] = *(double *)((long)psVar1 + lVar5 * 8 + lVar4 + 8) * x[lVar3] + y[lVar5 + 1]
          ;
          lVar5 = lVar5 + 1;
        } while (lVar5 < lVar6);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 1;
      lVar4 = lVar4 + -8;
    } while (lVar3 != n);
  }
  return;
}

Assistant:

void SUNDlsMat_bandMatvec(sunrealtype** a, sunrealtype* x, sunrealtype* y,
                          sunindextype n, sunindextype mu, sunindextype ml,
                          sunindextype smu)
{
  sunindextype i, j, is, ie;
  sunrealtype* col_j;

  for (i = 0; i < n; i++) { y[i] = ZERO; }

  for (j = 0; j < n; j++)
  {
    col_j = a[j] + smu - mu;
    is    = (0 > j - mu) ? 0 : j - mu;
    ie    = (n - 1 < j + ml) ? n - 1 : j + ml;
    for (i = is; i <= ie; i++) { y[i] += col_j[i - j + mu] * x[j]; }
  }
}